

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbsdf.c
# Opt level: O0

FT_Error finalize_sdf(BSDF_Worker *worker,FT_Bitmap *target)

{
  uint uVar1;
  uint uVar2;
  FT_UInt FVar3;
  uchar *puVar4;
  FT_SDFFormat FVar5;
  int iVar6;
  int iVar7;
  char local_4a;
  int local_48;
  FT_Char sign;
  FT_SDFFormat final_dist;
  FT_16D16 dist;
  FT_Int index;
  FT_16D16 spread;
  FT_16D16 sp_sq;
  FT_SDFFormat *t_buffer;
  int local_28;
  FT_Int j;
  FT_Int i;
  FT_Int r;
  FT_Int w;
  FT_Error error;
  FT_Bitmap *target_local;
  BSDF_Worker *worker_local;
  
  r = 0;
  if ((worker == (BSDF_Worker *)0x0) || (target == (FT_Bitmap *)0x0)) {
    r = 6;
  }
  else {
    uVar1 = target->width;
    uVar2 = target->rows;
    puVar4 = target->buffer;
    if ((uVar1 == worker->width) && (uVar2 == worker->rows)) {
      FVar3 = (worker->params).spread;
      iVar6 = (worker->params).spread << 0x10;
      for (t_buffer._4_4_ = 0; t_buffer._4_4_ < (int)uVar2; t_buffer._4_4_ = t_buffer._4_4_ + 1) {
        for (local_28 = 0; local_28 < (int)uVar1; local_28 = local_28 + 1) {
          iVar7 = t_buffer._4_4_ * uVar1 + local_28;
          local_48 = worker->distance_map[iVar7].dist;
          if ((local_48 < 0) || (iVar6 < local_48)) {
            local_48 = iVar6;
          }
          local_4a = '\x01';
          if (worker->distance_map[iVar7].alpha < 0x7f) {
            local_4a = -1;
          }
          if ((worker->params).flip_sign != '\0') {
            local_4a = -local_4a;
          }
          FVar5 = map_fixed_to_sdf(local_48 * local_4a,FVar3 << 0x10);
          puVar4[iVar7] = FVar5;
        }
      }
    }
    else {
      r = 6;
    }
  }
  return r;
}

Assistant:

static FT_Error
  finalize_sdf( BSDF_Worker*      worker,
                const FT_Bitmap*  target )
  {
    FT_Error  error = FT_Err_Ok;

    FT_Int  w, r;
    FT_Int  i, j;

    FT_SDFFormat*  t_buffer;
    FT_16D16       sp_sq, spread;


    if ( !worker || !target )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    w        = (int)target->width;
    r        = (int)target->rows;
    t_buffer = (FT_SDFFormat*)target->buffer;

    if ( w != worker->width ||
         r != worker->rows  )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    spread = (FT_16D16)FT_INT_16D16( worker->params.spread );

#if USE_SQUARED_DISTANCES
    sp_sq = (FT_16D16)FT_INT_16D16( worker->params.spread *
                                    worker->params.spread );
#else
    sp_sq = (FT_16D16)FT_INT_16D16( worker->params.spread );
#endif

    for ( j = 0; j < r; j++ )
    {
      for ( i = 0; i < w; i++ )
      {
        FT_Int        index;
        FT_16D16      dist;
        FT_SDFFormat  final_dist;
        FT_Char       sign;


        index = j * w + i;
        dist  = worker->distance_map[index].dist;

        if ( dist < 0 || dist > sp_sq )
          dist = sp_sq;

#if USE_SQUARED_DISTANCES
        dist = square_root( dist );
#endif

        /* We assume that if the pixel is inside a contour */
        /* its coverage value must be > 127.               */
        sign = worker->distance_map[index].alpha < 127 ? -1 : 1;

        /* flip the sign according to the property */
        if ( worker->params.flip_sign )
          sign = -sign;

        /* concatenate from 16.16 to appropriate format */
        final_dist = map_fixed_to_sdf( dist * sign, spread );

        t_buffer[index] = final_dist;
      }
    }

  Exit:
    return error;
  }